

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular_view_suite.cpp
# Opt level: O0

int main(void)

{
  int iVar1;
  
  api_dynamic_suite::run();
  api_fixed_suite::run();
  plain_array_suite::run();
  const_array_suite::run();
  std_array_suite::run();
  std_vector_suite::run();
  initialization_suite::run();
  clear_suite::run();
  window_size_suite::run();
  expand_suite::run();
  normalize_suite::run();
  iVar1 = boost::report_errors();
  return iVar1;
}

Assistant:

int main()
{
    api_dynamic_suite::run();
    api_fixed_suite::run();
    plain_array_suite::run();
    const_array_suite::run();
    std_array_suite::run();
    std_vector_suite::run();
    initialization_suite::run();
    clear_suite::run();
    window_size_suite::run();
    expand_suite::run();
    normalize_suite::run();
 
    return boost::report_errors();
}